

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O1

char fsnav_init_imu(fsnav_imu *imu)

{
  char cVar1;
  
  imu->w[1] = 0.0;
  imu->w[2] = 0.0;
  imu->t = 0.0;
  imu->w[0] = 0.0;
  imu->w_valid = '\0';
  imu->f[0] = 0.0;
  imu->f[1] = 0.0;
  *(undefined8 *)((long)imu->f + 9) = 0;
  *(undefined8 *)((long)imu->f + 0x11) = 0;
  imu->Tw[0] = 0.0;
  imu->Tw[1] = 0.0;
  *(undefined8 *)((long)imu->Tw + 9) = 0;
  *(undefined8 *)((long)imu->Tw + 0x11) = 0;
  imu->Tf[0] = 0.0;
  imu->Tf[1] = 0.0;
  *(undefined8 *)((long)imu->Tf + 9) = 0;
  *(undefined8 *)((long)imu->Tf + 0x11) = 0;
  imu->W[0] = 0.0;
  imu->W[1] = 0.0;
  *(undefined8 *)((long)imu->W + 9) = 0;
  *(undefined8 *)((long)imu->W + 0x11) = 0;
  imu->g[0] = 0.0;
  imu->g[1] = 0.0;
  imu->g[2] = ((fsnav->imu_const).fg * 0.5 + 1.0) * -(fsnav->imu_const).ge;
  cVar1 = fsnav_init_sol(&imu->sol,imu->cfg,imu->cfglength);
  return cVar1;
}

Assistant:

char fsnav_init_imu(fsnav_imu* imu)
{
	size_t i;

	// validity flags
	imu-> w_valid = 0;
	imu-> f_valid = 0;
	imu->Tw_valid = 0;
	imu->Tf_valid = 0;
	imu-> W_valid = 0;
	imu->t = 0;
	for (i = 0; i < 3; i++) {
		imu->w [i] = 0; // gyroscopes
		imu->f [i] = 0; // accelerometers
		imu->Tw[i] = 0; // gyroscope temperature
		imu->Tf[i] = 0; // accelerometer temperature
		imu->W [i] = 0; // angular velocity of the local level reference frame
	}
	// default gravity acceleration vector
	imu->g[0] = 0;
	imu->g[1] = 0;
	imu->g[2] = -fsnav->imu_const.ge*(1 + fsnav->imu_const.fg/2); // middle value
	// drop the solution
	if (!fsnav_init_sol(&(imu->sol), imu->cfg, imu->cfglength))
		return 0;

	return 1;
}